

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

UINT8 device_start_okim6295(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA devData;
  int local_30;
  int voicenum;
  UINT32 divisor;
  okim6295_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0x100);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      oki_adpcm_init((oki_adpcm_state *)((long)devData.chipInf + (long)local_30 * 0x30 + 8),
                     (INT8 *)0x0,(INT16 *)0x0);
    }
    *(undefined2 *)&((DEV_DATA *)((long)devData.chipInf + 200))->chipInf = 0xffff;
    *(undefined4 *)((long)devData.chipInf + 0xcc) = 0;
    *(undefined1 *)((long)devData.chipInf + 0xd2) = 0;
    memset(devData.chipInf + 0xd3,0,4);
    ((DEV_DATA *)((long)devData.chipInf + 0xe8))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0xe0))->chipInf = 0;
    *(UINT32 *)((long)devData.chipInf + 0xdc) = cfg->clock;
    *(UINT8 *)((long)devData.chipInf + 0xd1) = cfg->flags;
    ((DEV_DATA *)((long)devData.chipInf + 0xf0))->chipInf = (void *)0x0;
    *(undefined4 *)&((DEV_DATA *)((long)devData.chipInf + 0xd8))->chipInf =
         *(undefined4 *)((long)devData.chipInf + 0xdc);
    *(undefined1 *)&((DEV_DATA *)((long)devData.chipInf + 0xd0))->chipInf =
         *(undefined1 *)((long)devData.chipInf + 0xd1);
    uVar1 = 0xa5;
    if (*(char *)&((DEV_DATA *)((long)devData.chipInf + 0xd0))->chipInf != '\0') {
      uVar1 = 0x84;
    }
    okim6295_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,
                *(uint *)((long)devData.chipInf + 0xd8) / uVar1,&devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_okim6295(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6295_state *info;
	UINT32 divisor;
	int voicenum;

	info = (okim6295_state *)calloc(1, sizeof(okim6295_state));
	if (info == NULL)
		return 0xFF;

	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		oki_adpcm_init(&info->voice[voicenum].adpcm, NULL, NULL);

	info->command = -1;
	info->bank_offs = 0;
	info->nmk_mode = 0x00;
	memset(info->nmk_bank, 0x00, 4 * sizeof(UINT8));
	info->ROM = NULL;
	info->ROMSize = 0x00;

	info->initial_clock = cfg->clock;
	info->pin7_initial = cfg->flags;
	info->SmpRateFunc = NULL;

	info->master_clock = info->initial_clock;
	info->pin7_state = info->pin7_initial;
	divisor = info->pin7_state ? 132 : 165;

	okim6295_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->master_clock / divisor, &devDef);
	return 0x00;
}